

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O1

void lm_trie_free(lm_trie_t *trie)

{
  if (trie->ngram_mem != (uint8 *)0x0) {
    ckd_free(trie->ngram_mem);
    ckd_free(trie->middle_begin);
    ckd_free(trie->longest);
  }
  if (trie->quant != (lm_trie_quant_t *)0x0) {
    lm_trie_quant_free(trie->quant);
  }
  ckd_free(trie->unigrams);
  ckd_free(trie);
  return;
}

Assistant:

void
lm_trie_free(lm_trie_t * trie)
{
    if (trie->ngram_mem) {
        ckd_free(trie->ngram_mem);
        ckd_free(trie->middle_begin);
        ckd_free(trie->longest);
    }
    if (trie->quant)
        lm_trie_quant_free(trie->quant);
    ckd_free(trie->unigrams);
    ckd_free(trie);
}